

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Source.cpp
# Opt level: O3

int __thiscall
helics::apps::Source::addSignalGenerator(Source *this,string_view name,string_view type)

{
  pointer psVar1;
  int iVar2;
  size_t __n;
  char *__s2;
  int *__s1;
  int index;
  undefined1 local_39;
  PhasorGenerator *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_30;
  shared_ptr<helics::apps::SignalGenerator> local_28;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  
  __s1 = (int *)type._M_str;
  __n = type._M_len;
  local_18._M_str = name._M_str;
  local_18._M_len = name._M_len;
  local_28.super___shared_ptr<helics::apps::SignalGenerator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_28.super___shared_ptr<helics::apps::SignalGenerator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (__n == 10) {
    __s2 = "oscillator";
LAB_001dcc9f:
    iVar2 = bcmp(__s1,__s2,__n);
    if (iVar2 != 0) goto LAB_001dccfc;
    local_38 = (PhasorGenerator *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<helics::apps::PhasorGenerator,std::allocator<helics::apps::PhasorGenerator>,std::basic_string_view<char,std::char_traits<char>>&>
              (&_Stack_30,&local_38,(allocator<helics::apps::PhasorGenerator> *)&local_39,&local_18)
    ;
  }
  else {
    if (__n == 6) {
      __s2 = "phasor";
      goto LAB_001dcc9f;
    }
    if (__n != 4) goto LAB_001dccfc;
    if (*__s1 == 0x656e6973) {
      local_38 = (PhasorGenerator *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<helics::apps::SineGenerator,std::allocator<helics::apps::SineGenerator>,std::basic_string_view<char,std::char_traits<char>>&>
                (&_Stack_30,(SineGenerator **)&local_38,
                 (allocator<helics::apps::SineGenerator> *)&local_39,&local_18);
    }
    else {
      if (*__s1 != 0x706d6172) goto LAB_001dccfc;
      local_38 = (PhasorGenerator *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<helics::apps::RampGenerator,std::allocator<helics::apps::RampGenerator>,std::basic_string_view<char,std::char_traits<char>>&>
                (&_Stack_30,(RampGenerator **)&local_38,
                 (allocator<helics::apps::RampGenerator> *)&local_39,&local_18);
    }
  }
  local_28.super___shared_ptr<helics::apps::SignalGenerator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_38->super_SignalGenerator;
  local_28.super___shared_ptr<helics::apps::SignalGenerator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_30._M_pi;
LAB_001dccfc:
  std::
  vector<std::shared_ptr<helics::apps::SignalGenerator>,std::allocator<std::shared_ptr<helics::apps::SignalGenerator>>>
  ::emplace_back<std::shared_ptr<helics::apps::SignalGenerator>>
            ((vector<std::shared_ptr<helics::apps::SignalGenerator>,std::allocator<std::shared_ptr<helics::apps::SignalGenerator>>>
              *)&this->generators,&local_28);
  psVar1 = (this->generators).
           super__Vector_base<std::shared_ptr<helics::apps::SignalGenerator>,_std::allocator<std::shared_ptr<helics::apps::SignalGenerator>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_38 = (PhasorGenerator *)
             CONCAT44(local_38._4_4_,
                      (int)((ulong)((long)psVar1 -
                                   (long)(this->generators).
                                         super__Vector_base<std::shared_ptr<helics::apps::SignalGenerator>,_std::allocator<std::shared_ptr<helics::apps::SignalGenerator>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 4) + -1);
  std::
  _Rb_tree<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,int>,std::_Select1st<std::pair<std::basic_string_view<char,std::char_traits<char>>const,int>>,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,int>>>
  ::_M_emplace_unique<std::__cxx11::string_const&,int&>
            ((_Rb_tree<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,int>,std::_Select1st<std::pair<std::basic_string_view<char,std::char_traits<char>>const,int>>,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,int>>>
              *)&this->generatorLookup,
             &(psVar1[-1].
               super___shared_ptr<helics::apps::SignalGenerator,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->mName,(int *)&local_38);
  iVar2 = (int)local_38;
  if (local_28.super___shared_ptr<helics::apps::SignalGenerator,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.
               super___shared_ptr<helics::apps::SignalGenerator,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return iVar2;
}

Assistant:

int Source::addSignalGenerator(std::string_view name, std::string_view type)
    {
        std::shared_ptr<SignalGenerator> gen;
        if (type == "sine") {
            gen = std::make_shared<SineGenerator>(name);
        } else if (type == "ramp") {
            gen = std::make_shared<RampGenerator>(name);
        } else if ((type == "oscillator") || (type == "phasor")) {
            gen = std::make_shared<PhasorGenerator>(name);
        }
        generators.push_back(std::move(gen));
        auto index = static_cast<int>(generators.size() - 1);
        generatorLookup.emplace(generators.back()->getName(), index);
        return index;
    }